

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaVector.cpp
# Opt level: O0

void __thiscall NaVector::revert(NaVector *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  uint uVar4;
  undefined8 *puVar5;
  long *in_RDI;
  int N_2;
  int N;
  int i;
  NaReal tmp;
  undefined4 local_14;
  
  iVar3 = (**(code **)(*in_RDI + 0x30))();
  uVar4 = (**(code **)(*in_RDI + 0x30))();
  for (local_14 = 0; local_14 < (int)(uVar4 >> 1); local_14 = local_14 + 1) {
    puVar5 = (undefined8 *)(**(code **)(*in_RDI + 0x38))(in_RDI,local_14);
    uVar1 = *puVar5;
    puVar5 = (undefined8 *)(**(code **)(*in_RDI + 0x38))(in_RDI,(iVar3 + -1) - local_14);
    uVar2 = *puVar5;
    puVar5 = (undefined8 *)(**(code **)(*in_RDI + 0x38))(in_RDI,local_14);
    *puVar5 = uVar2;
    puVar5 = (undefined8 *)(**(code **)(*in_RDI + 0x38))(in_RDI,(iVar3 + -1) - local_14);
    *puVar5 = uVar1;
  }
  return;
}

Assistant:

void
NaVector::revert ()
{
  NaReal	tmp;
  int		i, N = dim(), N_2 = dim()/2;
  for(i = 0; i < N_2; ++i){
    tmp = fetch(i);
    fetch(i) = fetch(N - 1 - i);
    fetch(N - 1 - i) = tmp;
  }
}